

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb<int,_true,_5>_> __thiscall
immutable::rrb_details::rrb_drop_left<int,true,5>
          (rrb_details *this,ref<immutable::rrb<int,_true,_5>_> *in,uint32_t left)

{
  atomic<unsigned_int> *paVar1;
  atomic<unsigned_int> *paVar2;
  __int_type _Var3;
  uint uVar4;
  rrb<int,_true,_5> *prVar5;
  long lVar6;
  void *pvVar7;
  uint *puVar8;
  tree_node<int,_true> *ptVar9;
  int *piVar10;
  int *piVar11;
  leaf_node<int,_true> *plVar12;
  ref<immutable::rrb<int,_true,_5>_> p_node;
  rrb<int,_true,_5> *prVar13;
  leaf_node<int,_true> *plVar14;
  undefined4 *__ptr;
  undefined8 *puVar15;
  undefined8 *puVar16;
  leaf_node<int,_true> *plVar17;
  char *__function;
  ulong uVar18;
  uint32_t uVar19;
  ulong uVar20;
  uint uVar21;
  ref<immutable::rrb<int,_true,_5>_> new_rrb;
  ref<immutable::rrb_details::tree_node<int,_true>_> temp;
  ref<immutable::rrb<int,_true,_5>_> local_58;
  ref<immutable::rrb<int,_true,_5>_> local_50;
  uint local_44;
  rrb<int,_true,_5> *local_40;
  ref<immutable::rrb<int,_true,_5>_> *local_38;
  
  prVar13 = in->ptr;
  if (prVar13 != (rrb<int,_true,_5> *)0x0) {
    uVar4 = prVar13->cnt;
    uVar21 = uVar4 - left;
    if (uVar4 < left || uVar21 == 0) {
      puVar15 = (undefined8 *)malloc(0x28);
      *puVar15 = 0;
      *(undefined4 *)(puVar15 + 1) = 0;
      puVar16 = (undefined8 *)malloc(0x18);
      puVar15[2] = 0;
      puVar15[3] = 0;
      *puVar16 = 0;
      puVar16[2] = 0;
      *(undefined4 *)((long)puVar16 + 0xc) = 0;
      LOCK();
      *(undefined4 *)(puVar16 + 1) = 1;
      UNLOCK();
      LOCK();
      *(int *)(puVar16 + 1) = *(int *)(puVar16 + 1) + 1;
      UNLOCK();
      piVar10 = (int *)(puVar16 + 1);
      pvVar7 = (void *)puVar15[2];
      puVar15[2] = puVar16;
      if (pvVar7 != (void *)0x0) {
        LOCK();
        piVar11 = (int *)((long)pvVar7 + 8);
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          free(pvVar7);
        }
      }
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        free(puVar16);
      }
      *(undefined8 **)this = puVar15;
      LOCK();
      *(undefined4 *)(puVar15 + 4) = 1;
      UNLOCK();
      return (ref<immutable::rrb<int,_true,_5>_>)(rrb<int,_true,_5> *)this;
    }
    if (left == 0) {
LAB_0011a4f4:
      prVar13 = in->ptr;
      if (prVar13 != (rrb<int,_true,_5> *)0x0) {
        if ((prVar13->shift != 0) ||
           (ptVar9 = (prVar13->root).ptr, ptVar9 == (tree_node<int,_true> *)0x0)) {
LAB_0011a506:
          prVar13 = in->ptr;
          *(rrb<int,_true,_5> **)this = prVar13;
          if (prVar13 != (rrb<int,_true,_5> *)0x0) {
            LOCK();
            (prVar13->_ref_count).super___atomic_base<unsigned_int>._M_i =
                 (prVar13->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
            UNLOCK();
          }
          return (ref<immutable::rrb<int,_true,_5>_>)(rrb<int,_true,_5> *)this;
        }
        uVar4 = prVar13->cnt;
        uVar18 = (ulong)uVar4;
        if (uVar18 < 0x21) {
          plVar17 = (leaf_node<int,_true> *)malloc(uVar18 * 4 + 0x18);
          plVar17->len = uVar4;
          plVar17->type = LEAF_NODE;
          plVar17->child = (int *)(plVar17 + 1);
          plVar17->guid = 0;
          if (uVar4 != 0) {
            memset(plVar17 + 1,0,uVar18 << 2);
          }
          LOCK();
          (plVar17->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
          UNLOCK();
          prVar13 = in->ptr;
          if (prVar13 != (rrb<int,_true,_5> *)0x0) {
            ptVar9 = (prVar13->root).ptr;
            if (ptVar9 != (tree_node<int,_true> *)0x0) {
              uVar18 = 0;
LAB_0011a59a:
              if (uVar18 < ptVar9->len) goto code_r0x0011a5a6;
              if (prVar13->tail_len == 0) goto LAB_0011a73d;
              plVar14 = (prVar13->tail).ptr;
              if (plVar14 != (leaf_node<int,_true> *)0x0) {
                piVar10 = plVar14->child;
                piVar11 = plVar17->child;
                uVar18 = 0;
                do {
                  piVar11[ptVar9->len + (int)uVar18] = piVar10[uVar18];
                  uVar18 = uVar18 + 1;
                } while (uVar18 < prVar13->tail_len);
LAB_0011a73d:
                prVar13->tail_len = prVar13->cnt;
                local_58.ptr = (rrb<int,_true,_5> *)0x0;
                local_50.ptr = (rrb<int,_true,_5> *)(prVar13->root).ptr;
                (prVar13->root).ptr = (tree_node<int,_true> *)0x0;
                ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
                          ((ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_50);
                ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
                          ((ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_58);
                prVar13 = in->ptr;
                if (prVar13 != (rrb<int,_true,_5> *)0x0) {
                  LOCK();
                  (plVar17->_ref_count).super___atomic_base<unsigned_int>._M_i =
                       (plVar17->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
                  UNLOCK();
                  plVar14 = (prVar13->tail).ptr;
                  (prVar13->tail).ptr = plVar17;
                  if (plVar14 != (leaf_node<int,_true> *)0x0) {
                    LOCK();
                    paVar1 = &plVar14->_ref_count;
                    (paVar1->super___atomic_base<unsigned_int>)._M_i =
                         (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
                    _Var3 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
                    UNLOCK();
joined_r0x0011a861:
                    if (_Var3 == 0) {
                      free(plVar14);
                    }
                  }
                  LOCK();
                  paVar1 = &plVar17->_ref_count;
                  (paVar1->super___atomic_base<unsigned_int>)._M_i =
                       (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
                  UNLOCK();
                  if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
                    free(plVar17);
                  }
                  goto LAB_0011a506;
                }
                goto LAB_0011a6e6;
              }
              goto LAB_0011a883;
            }
LAB_0011a8b7:
            __function = 
            "T *immutable::ref<immutable::rrb_details::tree_node<int, true>>::operator->() const [T = immutable::rrb_details::tree_node<int, true>]"
            ;
            goto LAB_0011a6fb;
          }
        }
        else {
          if (0x1f < uVar4 - prVar13->tail_len) goto LAB_0011a506;
          uVar4 = ptVar9->len;
          local_40 = (rrb<int,_true,_5> *)this;
          plVar17 = (leaf_node<int,_true> *)malloc(0x98);
          plVar17->type = LEAF_NODE;
          plVar17->len = 0x20;
          plVar17->child = (int *)(plVar17 + 1);
          plVar17->guid = 0;
          plVar17[1].type = LEAF_NODE;
          plVar17[1].len = 0;
          plVar17[1]._ref_count = (__atomic_base<unsigned_int>)0x0;
          plVar17[1].guid = 0;
          plVar17[1].child = (int *)0x0;
          plVar17[2].type = LEAF_NODE;
          plVar17[2].len = 0;
          plVar17[2]._ref_count = (__atomic_base<unsigned_int>)0x0;
          plVar17[2].guid = 0;
          plVar17[2].child = (int *)0x0;
          plVar17[3].type = LEAF_NODE;
          plVar17[3].len = 0;
          plVar17[3]._ref_count = (__atomic_base<unsigned_int>)0x0;
          plVar17[3].guid = 0;
          plVar17[3].child = (int *)0x0;
          plVar17[4].type = LEAF_NODE;
          plVar17[4].len = 0;
          plVar17[4]._ref_count = (__atomic_base<unsigned_int>)0x0;
          plVar17[4].guid = 0;
          plVar17[4].child = (int *)0x0;
          plVar17[5].type = LEAF_NODE;
          plVar17[5].len = 0;
          plVar17[5]._ref_count = (__atomic_base<unsigned_int>)0x0;
          plVar17[5].guid = 0;
          plVar17[5].child = (int *)0x0;
          plVar17[6].type = LEAF_NODE;
          plVar17[6].len = 0;
          LOCK();
          (plVar17->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
          UNLOCK();
          if (in->ptr != (rrb<int,_true,_5> *)0x0) {
            uVar21 = 0x20 - uVar4;
            uVar19 = in->ptr->tail_len;
            uVar18 = (ulong)(uVar19 - uVar21);
            local_44 = uVar4;
            plVar14 = (leaf_node<int,_true> *)malloc(uVar18 * 4 + 0x18);
            uVar19 = uVar19 - uVar21;
            plVar14->len = uVar19;
            plVar14->type = LEAF_NODE;
            plVar14->child = (int *)(plVar14 + 1);
            plVar14->guid = 0;
            if (uVar19 != 0) {
              memset(plVar14 + 1,0,uVar18 << 2);
            }
            this = (rrb_details *)local_40;
            LOCK();
            (plVar14->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
            UNLOCK();
            prVar13 = in->ptr;
            if (prVar13 != (rrb<int,_true,_5> *)0x0) {
              ptVar9 = (prVar13->root).ptr;
              if (ptVar9 != (tree_node<int,_true> *)0x0) {
                uVar18 = 0;
LAB_0011a6c4:
                if (uVar18 < ptVar9->len) goto code_r0x0011a6d0;
                if (local_44 == 0x20) goto LAB_0011a7d4;
                plVar12 = (prVar13->tail).ptr;
                if (plVar12 != (leaf_node<int,_true> *)0x0) {
                  piVar10 = plVar12->child;
                  piVar11 = plVar17->child;
                  uVar18 = 0;
                  do {
                    piVar11[ptVar9->len + (int)uVar18] = piVar10[uVar18];
                    uVar18 = uVar18 + 1;
                  } while (uVar21 != uVar18);
LAB_0011a7d4:
                  uVar19 = prVar13->tail_len - uVar21;
                  if (uVar19 != 0) {
                    plVar12 = (prVar13->tail).ptr;
                    if (plVar12 != (leaf_node<int,_true> *)0x0) {
                      piVar10 = plVar12->child;
                      piVar11 = plVar14->child;
                      uVar18 = 0;
                      do {
                        piVar11[uVar18] = piVar10[uVar21 + (int)uVar18];
                        uVar18 = uVar18 + 1;
                        uVar19 = prVar13->tail_len - uVar21;
                      } while (uVar18 < uVar19);
                      goto LAB_0011a810;
                    }
                    goto LAB_0011a883;
                  }
LAB_0011a810:
                  prVar13->tail_len = uVar19;
                  LOCK();
                  (plVar14->_ref_count).super___atomic_base<unsigned_int>._M_i =
                       (plVar14->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
                  UNLOCK();
                  plVar12 = (prVar13->tail).ptr;
                  (prVar13->tail).ptr = plVar14;
                  if (plVar12 != (leaf_node<int,_true> *)0x0) {
                    LOCK();
                    paVar1 = &plVar12->_ref_count;
                    (paVar1->super___atomic_base<unsigned_int>)._M_i =
                         (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
                    UNLOCK();
                    if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
                      free(plVar12);
                    }
                  }
                  prVar13 = in->ptr;
                  if (prVar13 != (rrb<int,_true,_5> *)0x0) {
                    LOCK();
                    (plVar17->_ref_count).super___atomic_base<unsigned_int>._M_i =
                         (plVar17->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
                    UNLOCK();
                    local_50.ptr = (rrb<int,_true,_5> *)(prVar13->root).ptr;
                    (prVar13->root).ptr = (tree_node<int,_true> *)plVar17;
                    ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
                              ((ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_50);
                    LOCK();
                    paVar1 = &plVar14->_ref_count;
                    (paVar1->super___atomic_base<unsigned_int>)._M_i =
                         (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
                    _Var3 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
                    UNLOCK();
                    goto joined_r0x0011a861;
                  }
                  goto LAB_0011a6e6;
                }
                goto LAB_0011a883;
              }
              goto LAB_0011a8b7;
            }
          }
        }
      }
    }
    else {
      local_44 = prVar13->tail_len;
      local_40 = (rrb<int,_true,_5> *)this;
      if (local_44 < uVar21) {
        prVar13 = (rrb<int,_true,_5> *)malloc(0x28);
        prVar13->cnt = 0;
        prVar13->shift = 0;
        prVar13->tail_len = 0;
        plVar14 = (leaf_node<int,_true> *)malloc(0x18);
        (prVar13->tail).ptr = (leaf_node<int,_true> *)0x0;
        (prVar13->root).ptr = (tree_node<int,_true> *)0x0;
        plVar14->type = LEAF_NODE;
        plVar14->len = 0;
        plVar14->child = (int *)0x0;
        plVar14->guid = 0;
        LOCK();
        (plVar14->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
        UNLOCK();
        LOCK();
        (plVar14->_ref_count).super___atomic_base<unsigned_int>._M_i =
             (plVar14->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
        paVar1 = &plVar14->_ref_count;
        plVar17 = (prVar13->tail).ptr;
        (prVar13->tail).ptr = plVar14;
        if (plVar17 != (leaf_node<int,_true> *)0x0) {
          LOCK();
          paVar2 = &plVar17->_ref_count;
          (paVar2->super___atomic_base<unsigned_int>)._M_i =
               (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
          UNLOCK();
          if ((paVar2->super___atomic_base<unsigned_int>)._M_i == 0) {
            free(plVar17);
          }
        }
        LOCK();
        (paVar1->super___atomic_base<unsigned_int>)._M_i =
             (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
        if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
          free(plVar14);
        }
        this = (rrb_details *)local_40;
        LOCK();
        (prVar13->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
        UNLOCK();
        local_58.ptr = prVar13;
        if ((prVar13 != (rrb<int,_true,_5> *)0x0) &&
           (prVar5 = in->ptr, prVar5 != (rrb<int,_true,_5> *)0x0)) {
          rrb_drop_left_rec<int,true,5>
                    ((rrb_details *)&local_50,&prVar13->shift,&prVar5->root,left,prVar5->shift,false
                    );
          p_node.ptr = local_50.ptr;
          if (local_50.ptr != (rrb<int,_true,_5> *)0x0) {
            LOCK();
            (local_50.ptr)->tail_len = (local_50.ptr)->tail_len + 1;
            UNLOCK();
          }
          ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
                    ((ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_50);
          if (local_58.ptr != (rrb<int,_true,_5> *)0x0) {
            (local_58.ptr)->cnt = uVar21;
            if (p_node.ptr != (rrb<int,_true,_5> *)0x0) {
              LOCK();
              (p_node.ptr)->tail_len = (p_node.ptr)->tail_len + 1;
              UNLOCK();
            }
            local_50.ptr = (rrb<int,_true,_5> *)((local_58.ptr)->root).ptr;
            ((local_58.ptr)->root).ptr = (tree_node<int,_true> *)p_node.ptr;
            ref<immutable::rrb_details::tree_node<int,_true>_>::~ref
                      ((ref<immutable::rrb_details::tree_node<int,_true>_> *)&local_50);
            if (local_58.ptr != (rrb<int,_true,_5> *)0x0) {
              if ((local_58.ptr)->shift != 0) {
                if (p_node.ptr == (rrb<int,_true,_5> *)0x0) {
                  __function = 
                  "T *immutable::ref<immutable::rrb_details::internal_node<int, true>>::operator->() const [T = immutable::rrb_details::internal_node<int, true>]"
                  ;
                  goto LAB_0011a6fb;
                }
                plVar17 = ((p_node.ptr)->tail).ptr;
                if (plVar17 != (leaf_node<int,_true> *)0x0) {
                  if (in->ptr == (rrb<int,_true,_5> *)0x0) goto LAB_0011a6e6;
                  *(uint32_t *)(*(long *)plVar17 + (ulong)((p_node.ptr)->shift - 1) * 4) =
                       (local_58.ptr)->cnt - in->ptr->tail_len;
                }
              }
              if (in->ptr != (rrb<int,_true,_5> *)0x0) {
                ref<immutable::rrb_details::leaf_node<int,_true>_>::operator=
                          (&(local_58.ptr)->tail,&in->ptr->tail);
                if ((in->ptr != (rrb<int,_true,_5> *)0x0) &&
                   (local_58.ptr != (rrb<int,_true,_5> *)0x0)) {
                  (local_58.ptr)->tail_len = in->ptr->tail_len;
                  LOCK();
                  ((local_58.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
                       ((local_58.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
                  UNLOCK();
                  local_50 = (ref<immutable::rrb<int,_true,_5>_>)in->ptr;
                  in->ptr = (rrb<int,_true,_5> *)local_58;
                  ref<immutable::rrb<int,_true,_5>_>::~ref(&local_50);
                  release<int>((internal_node<int,_true> *)p_node.ptr);
                  ref<immutable::rrb<int,_true,_5>_>::~ref(&local_58);
                  goto LAB_0011a4ed;
                }
              }
            }
          }
        }
      }
      else {
        uVar18 = (ulong)uVar21;
        local_38 = in;
        __ptr = (undefined4 *)malloc(uVar18 * 4 + 0x18);
        __ptr[1] = uVar21;
        *__ptr = 0;
        *(undefined4 **)(__ptr + 4) = __ptr + 6;
        __ptr[3] = 0;
        if (uVar4 != left) {
          memset(__ptr + 6,0,uVar18 * 4);
        }
        LOCK();
        __ptr[2] = 1;
        UNLOCK();
        if (uVar4 != left) {
          prVar13 = local_38->ptr;
          if (prVar13 == (rrb<int,_true,_5> *)0x0) goto LAB_0011a6e6;
          plVar17 = (prVar13->tail).ptr;
          if (plVar17 == (leaf_node<int,_true> *)0x0) {
LAB_0011a883:
            __function = 
            "T *immutable::ref<immutable::rrb_details::leaf_node<int, true>>::operator->() const [T = immutable::rrb_details::leaf_node<int, true>]"
            ;
            goto LAB_0011a6fb;
          }
          piVar10 = plVar17->child;
          lVar6 = *(long *)(__ptr + 4);
          uVar20 = 0;
          do {
            *(int *)(lVar6 + uVar20 * 4) = piVar10[(left - uVar4) + (int)uVar20 + prVar13->tail_len]
            ;
            uVar20 = uVar20 + 1;
          } while (uVar18 != uVar20);
        }
        puVar15 = (undefined8 *)malloc(0x28);
        *puVar15 = 0;
        *(undefined4 *)(puVar15 + 1) = 0;
        puVar16 = (undefined8 *)malloc(0x18);
        puVar15[2] = 0;
        puVar15[3] = 0;
        *puVar16 = 0;
        puVar16[2] = 0;
        *(undefined4 *)((long)puVar16 + 0xc) = 0;
        LOCK();
        *(undefined4 *)(puVar16 + 1) = 1;
        UNLOCK();
        LOCK();
        *(int *)(puVar16 + 1) = *(int *)(puVar16 + 1) + 1;
        UNLOCK();
        piVar10 = (int *)(puVar16 + 1);
        pvVar7 = (void *)puVar15[2];
        puVar15[2] = puVar16;
        if (pvVar7 != (void *)0x0) {
          LOCK();
          piVar11 = (int *)((long)pvVar7 + 8);
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            free(pvVar7);
          }
        }
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          free(puVar16);
        }
        in = local_38;
        this = (rrb_details *)local_40;
        *(undefined8 **)local_40 = puVar15;
        LOCK();
        *(undefined4 *)(puVar15 + 4) = 1;
        UNLOCK();
        puVar8 = *(uint **)local_40;
        if (puVar8 != (uint *)0x0) {
          *puVar8 = uVar21;
          puVar8[2] = uVar21;
          LOCK();
          __ptr[2] = __ptr[2] + 1;
          UNLOCK();
          pvVar7 = *(void **)(puVar8 + 4);
          *(undefined4 **)(puVar8 + 4) = __ptr;
          if (pvVar7 != (void *)0x0) {
            LOCK();
            piVar10 = (int *)((long)pvVar7 + 8);
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              free(pvVar7);
            }
          }
          LOCK();
          piVar10 = __ptr + 2;
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            free(__ptr);
          }
LAB_0011a4ed:
          if (uVar21 <= local_44) {
            return (ref<immutable::rrb<int,_true,_5>_>)(rrb<int,_true,_5> *)this;
          }
          goto LAB_0011a4f4;
        }
      }
    }
  }
LAB_0011a6e6:
  __function = 
  "T *immutable::ref<immutable::rrb<int>>::operator->() const [T = immutable::rrb<int>]";
LAB_0011a6fb:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
code_r0x0011a6d0:
  plVar17->child[uVar18] = *(int *)(*(long *)(ptVar9 + 1) + uVar18 * 4);
  uVar18 = uVar18 + 1;
  if (prVar13 == (rrb<int,_true,_5> *)0x0) goto LAB_0011a6e6;
  goto LAB_0011a6c4;
code_r0x0011a5a6:
  plVar17->child[uVar18] = *(int *)(*(long *)(ptVar9 + 1) + uVar18 * 4);
  uVar18 = uVar18 + 1;
  if (prVar13 == (rrb<int,_true,_5> *)0x0) goto LAB_0011a6e6;
  goto LAB_0011a59a;
}

Assistant:

T* ref<T>::operator->() const
      {
      assert(ptr != nullptr);
      return ptr;
      }